

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhPageSplit(lhpage *pOld,lhpage *pNew,pgno split_bucket,pgno high_mask)

{
  sxu32 nSize;
  lhcell *plVar1;
  lhcell *pCell;
  int iVar2;
  int iVar3;
  lhcell *pCell_00;
  sxu16 nOfft;
  SyBlob sWorker;
  sxu16 local_62;
  lhpage *local_60;
  SyMemBackend *local_58;
  void *local_50;
  undefined8 uStack_48;
  uint local_40;
  lhpage *local_38;
  
  local_58 = &pOld->pHash->sAllocator;
  local_50 = (void *)0x0;
  uStack_48 = 0;
  local_40 = 0;
  plVar1 = pOld->pList;
  local_60 = pNew;
  while (pCell = plVar1, pCell != (lhcell *)0x0) {
    plVar1 = pCell->pNext;
    if ((pCell->nHash & (uint)high_mask) != split_bucket) {
      if (pCell->iOvfl == 0) {
        uStack_48 = uStack_48 & 0xffffffff00000000;
        if ((local_40 & 4) != 0) {
          local_50 = (void *)0x0;
          uStack_48 = 0;
          local_40 = local_40 & 0xfffffffb;
        }
        if ((((pCell->sKey).nByte == 0) &&
            (iVar2 = lhConsumeCellkey(pCell,unqliteDataConsumer,&pCell->sKey,0), iVar2 != 0)) ||
           (iVar2 = lhConsumeCellData(pCell,unqliteDataConsumer,&local_58), iVar2 != 0))
        goto LAB_00114e42;
        iVar2 = lhStoreCell(local_60,(pCell->sKey).pBlob,(pCell->sKey).nByte,local_50,
                            uStack_48 & 0xffffffff,pCell->nHash,1);
      }
      else {
        local_38 = local_60;
        iVar2 = lhAllocateSpace(local_60,0x1a,&local_62);
        if ((iVar2 == 0) || (iVar2 = lhFindSlavePage(local_60,0x1a,&local_62,&local_38), iVar2 == 0)
           ) {
          pCell_00 = lhNewCell(local_38->pHash,local_38);
          iVar2 = -1;
          if (pCell_00 != (lhcell *)0x0) {
            pCell_00->iStart = local_62;
            pCell_00->nData = pCell->nData;
            pCell_00->nKey = pCell->nKey;
            pCell_00->iOvfl = pCell->iOvfl;
            pCell_00->iDataOfft = pCell->iDataOfft;
            pCell_00->iDataPage = pCell->iDataPage;
            pCell_00->nHash = pCell->nHash;
            nSize = (pCell->sKey).nByte;
            if (nSize != 0) {
              SyBlobAppend(&pCell_00->sKey,(pCell->sKey).pBlob,nSize);
            }
            iVar3 = lhInstallCell(pCell_00);
            if (iVar3 == 0) {
              lhCellWriteHeader(pCell_00);
              iVar2 = 0;
            }
          }
        }
      }
      if (iVar2 != 0) goto LAB_00114e42;
      lhUnlinkCell(pCell);
    }
  }
  iVar2 = 0;
LAB_00114e42:
  if (((local_40 & 6) == 0) && (uStack_48._4_4_ != 0)) {
    SyMemBackendFree(local_58,local_50);
  }
  return iVar2;
}

Assistant:

static int lhPageSplit(
	lhpage *pOld,      /* Page to be split */
	lhpage *pNew,      /* New page */
	pgno split_bucket, /* Current split bucket */
	pgno high_mask     /* High mask (Max split bucket - 1) */
	)
{
	lhcell *pCell,*pNext;
	SyBlob sWorker;
	pgno iBucket;
	int rc; 
	SyBlobInit(&sWorker,&pOld->pHash->sAllocator);
	/* Perform the split */
	pCell = pOld->pList;
	for( ;; ){
		if( pCell == 0 ){
			/* No more cells */
			break;
		}
		/* Obtain the new logical bucket */
		iBucket = pCell->nHash & high_mask;
		pNext =  pCell->pNext;
		if( iBucket != split_bucket){
			rc = UNQLITE_OK;
			if( pCell->iOvfl ){
				/* Transfer the cell only */
				rc = lhTransferCell(pCell,pNew);
			}else{
				/* Transfer the cell and its payload */
				SyBlobReset(&sWorker);
				if( SyBlobLength(&pCell->sKey) < 1 ){
					/* Consume the key */
					rc = lhConsumeCellkey(pCell,unqliteDataConsumer,&pCell->sKey,0);
					if( rc != UNQLITE_OK ){
						goto fail;
					}
				}
				/* Consume the data (Very small data < 65k) */
				rc = lhConsumeCellData(pCell,unqliteDataConsumer,&sWorker);
				if( rc != UNQLITE_OK ){
					goto fail;
				}
				/* Perform the transfer */
				rc = lhStoreCell(
					pNew,
					SyBlobData(&pCell->sKey),(int)SyBlobLength(&pCell->sKey),
					SyBlobData(&sWorker),SyBlobLength(&sWorker),
					pCell->nHash,
					1
					);
			}
			if( rc != UNQLITE_OK ){
				goto fail;
			}
			/* Discard the cell from the old page */
			lhUnlinkCell(pCell);
		}
		/* Point to the next cell */
		pCell = pNext;
	}
	/* All done */
	rc = UNQLITE_OK;
fail:
	SyBlobRelease(&sWorker);
	return rc;
}